

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O0

void * mi_calloc(size_t count,size_t size)

{
  void *pvVar1;
  size_t in_RSI;
  mi_heap_t *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  mi_prim_get_default_heap();
  pvVar1 = mi_heap_calloc(in_RDI,in_RSI,in_stack_ffffffffffffffe8);
  return pvVar1;
}

Assistant:

void* mi_calloc(size_t count, size_t size) mi_attr_noexcept {
  return mi_heap_calloc(mi_prim_get_default_heap(),count,size);
}